

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

bool __thiscall
SQVM::CLASS_OP(SQVM *this,SQObjectPtr *target,SQInteger baseclass,SQInteger attributes)

{
  bool bVar1;
  SQChar *pSVar2;
  long in_RCX;
  SQBool in_RDX;
  SQObjectPtr *in_RSI;
  SQVM *in_RDI;
  SQObjectPtr *unaff_retaddr;
  SQVM *in_stack_00000008;
  SQObjectPtr ret;
  int nparams;
  SQObjectPtr attrs;
  SQClass *base;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  SQClass *in_stack_ffffffffffffff80;
  SQClass *in_stack_ffffffffffffff88;
  SQObjectPtr local_68;
  undefined4 local_54;
  uint local_50;
  SQObjectPtr local_40;
  SQObjectValue local_30;
  long local_28;
  SQVM *stackbase;
  undefined7 in_stack_fffffffffffffff8;
  byte in_stack_ffffffffffffffff;
  
  local_30.pTable = (SQTable *)0x0;
  local_28 = in_RCX;
  stackbase = in_RDI;
  ::SQObjectPtr::SQObjectPtr(&local_40);
  if (in_RDX != 0xffffffffffffffff) {
    if ((in_RDI->_stack)._vals[in_RDI->_stackbase + in_RDX].super_SQObject._type != OT_CLASS) {
      pSVar2 = GetTypeName((SQObjectPtr *)0x13dd36);
      Raise_Error(in_RDI,"trying to inherit from a %s",pSVar2);
      in_stack_ffffffffffffffff = 0;
      local_50 = 1;
      goto LAB_0013df2b;
    }
    local_30 = (in_RDI->_stack)._vals[in_RDI->_stackbase + in_RDX].super_SQObject._unVal;
  }
  if (local_28 != 0xff) {
    ::SQObjectPtr::operator=((SQObjectPtr *)in_RDI,(SQObjectPtr *)in_stack_ffffffffffffff88);
  }
  in_stack_ffffffffffffff80 =
       SQClass::Create((SQSharedState *)in_stack_ffffffffffffff80,
                       (SQClass *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
  ::SQObjectPtr::operator=((SQObjectPtr *)in_RDI,in_stack_ffffffffffffff88);
  if (((in_RSI->super_SQObject)._unVal.pClass)->_metamethods[0x11].super_SQObject._type != OT_NULL)
  {
    local_54 = 2;
    ::SQObjectPtr::SQObjectPtr(&local_68);
    Push((SQVM *)in_stack_ffffffffffffff80,
         (SQObjectPtr *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
    Push((SQVM *)in_stack_ffffffffffffff80,
         (SQObjectPtr *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
    bVar1 = Call(in_stack_00000008,unaff_retaddr,
                 CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),(SQInteger)stackbase,
                 in_RSI,in_RDX);
    if (bVar1) {
      Pop(in_RDI,(SQInteger)in_stack_ffffffffffffff88);
    }
    else {
      Pop(in_RDI,(SQInteger)in_stack_ffffffffffffff88);
      in_stack_ffffffffffffffff = 0;
    }
    local_50 = (uint)!bVar1;
    ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff80);
    if (local_50 != 0) goto LAB_0013df2b;
  }
  ::SQObjectPtr::operator=((SQObjectPtr *)in_RDI,(SQObjectPtr *)in_stack_ffffffffffffff88);
  in_stack_ffffffffffffffff = 1;
  local_50 = 1;
LAB_0013df2b:
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff80);
  return (bool)(in_stack_ffffffffffffffff & 1);
}

Assistant:

bool SQVM::CLASS_OP(SQObjectPtr &target,SQInteger baseclass,SQInteger attributes)
{
    SQClass *base = NULL;
    SQObjectPtr attrs;
    if(baseclass != -1) {
        if(type(_stack._vals[_stackbase+baseclass]) != OT_CLASS) { Raise_Error(_SC("trying to inherit from a %s"),GetTypeName(_stack._vals[_stackbase+baseclass])); return false; }
        base = _class(_stack._vals[_stackbase + baseclass]);
    }
    if(attributes != MAX_FUNC_STACKSIZE) {
        attrs = _stack._vals[_stackbase+attributes];
    }
    target = SQClass::Create(_ss(this),base);
    if(type(_class(target)->_metamethods[MT_INHERITED]) != OT_NULL) {
        int nparams = 2;
        SQObjectPtr ret;
        Push(target); Push(attrs);
        if(!Call(_class(target)->_metamethods[MT_INHERITED],nparams,_top - nparams, ret, false)) {
            Pop(nparams);
            return false;
        }
        Pop(nparams);
    }
    _class(target)->_attributes = attrs;
    return true;
}